

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_result_blob(sqlite3_context *pCtx,void *z,int n,_func_void_void_ptr *xDel)

{
  _func_void_void_ptr *xDel_local;
  int n_local;
  void *z_local;
  sqlite3_context *pCtx_local;
  
  setResultStrOrError(pCtx,(char *)z,n,'\0',xDel);
  return;
}

Assistant:

SQLITE_API void sqlite3_result_blob(
  sqlite3_context *pCtx,
  const void *z,
  int n,
  void (*xDel)(void *)
){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCtx==0 || n<0 ){
    invokeValueDestructor(z, xDel, pCtx);
    return;
  }
#endif
  assert( n>=0 );
  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
  setResultStrOrError(pCtx, z, n, 0, xDel);
}